

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgtrmr(fitsfile *gfptr,HDUtracker *HDU,int *status)

{
  int iVar1;
  int iVar2;
  HDUtracker *in_RDX;
  fitsfile *in_RSI;
  bool bVar3;
  fitsfile *mfptr;
  char comment [73];
  char keyvalue [71];
  long nmembers;
  int hdutype;
  int i;
  char *in_stack_00000758;
  int *in_stack_00000760;
  HDUtracker *in_stack_00000768;
  fitsfile *in_stack_00000770;
  int *in_stack_000008d8;
  int in_stack_000008e4;
  fitsfile *in_stack_000008e8;
  int *in_stack_00001950;
  fitsfile **in_stack_00001958;
  long in_stack_00001960;
  fitsfile *in_stack_00001968;
  fitsfile *fptr;
  fitsfile *in_stack_ffffffffffffff38;
  int *in_stack_ffffffffffffff58;
  int *in_stack_ffffffffffffff60;
  fitsfile *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff89;
  int *in_stack_ffffffffffffffb8;
  long *in_stack_ffffffffffffffc0;
  fitsfile *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd8;
  int local_4;
  
  fptr = (fitsfile *)0x0;
  if (in_RDX->nHDU == 0) {
    iVar1 = ffgtnm(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    in_RDX->nHDU = iVar1;
    iVar1 = 0;
    while( true ) {
      bVar3 = false;
      if (0 < iVar1) {
        bVar3 = in_RDX->nHDU == 0;
      }
      if (!bVar3) break;
      iVar2 = ffgmop(in_stack_00001968,in_stack_00001960,in_stack_00001958,in_stack_00001950);
      in_RDX->nHDU = iVar2;
      if (in_RDX->nHDU == 0x156) {
        in_RDX->nHDU = 0;
      }
      else if (in_RDX->nHDU == 0) {
        iVar2 = fftsad(in_stack_00000770,in_stack_00000768,in_stack_00000760,in_stack_00000758);
        in_RDX->nHDU = iVar2;
        if (in_RDX->nHDU == 0x15a) {
          in_RDX->nHDU = 0;
          ffclos(in_stack_ffffffffffffff38,&fptr->HDUposition);
        }
        else if (in_RDX->nHDU == 0) {
          iVar2 = ffgkys((fitsfile *)CONCAT71(in_stack_ffffffffffffff89,in_stack_ffffffffffffff88),
                         in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                         in_stack_ffffffffffffff70,&in_stack_ffffffffffffff68->HDUposition);
          in_RDX->nHDU = iVar2;
          if (in_RDX->nHDU == 0xca) {
            in_RDX->nHDU = 0;
            in_stack_ffffffffffffff88 = 0;
          }
          prepare_keyvalue((char *)fptr);
          if (in_RDX->nHDU == 0) {
            iVar2 = fits_strcasecmp((char *)in_stack_ffffffffffffff38,(char *)fptr);
            if (iVar2 == 0) {
              iVar2 = ffgtrmr(in_RSI,in_RDX,(int *)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
              in_RDX->nHDU = iVar2;
            }
            iVar2 = ffghdn(fptr,(int *)&stack0xffffffffffffffd8);
            if (iVar2 == 1) {
              iVar2 = ffgmul(in_stack_000008e8,in_stack_000008e4,in_stack_000008d8);
              in_RDX->nHDU = iVar2;
            }
            else {
              iVar2 = ffgmul(in_stack_000008e8,in_stack_000008e4,in_stack_000008d8);
              in_RDX->nHDU = iVar2;
              iVar2 = ffdhdu(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                             in_stack_ffffffffffffff58);
              in_RDX->nHDU = iVar2;
            }
            ffclos(in_stack_ffffffffffffff38,&fptr->HDUposition);
          }
        }
      }
      iVar1 = iVar1 + -1;
    }
    local_4 = in_RDX->nHDU;
  }
  else {
    local_4 = in_RDX->nHDU;
  }
  return local_4;
}

Assistant:

int ffgtrmr(fitsfile   *gfptr,  /* FITS file pointer to group               */
	    HDUtracker *HDU,    /* list of processed HDUs                   */
	    int        *status) /* return status code                       */
	    
/*
  recursively remove a grouping table and all its members. Each member of
  the grouping table pointed to by gfptr it processed. If the member is itself
  a grouping table then ffgtrmr() is recursively called to process all
  of its members. The HDUtracker struct *HDU is used to make sure a member
  is not processed twice, thus avoiding an infinite loop (e.g., a grouping
  table contains itself as a member).
*/

{
  int i;
  int hdutype;

  long nmembers = 0;

  char keyvalue[FLEN_VALUE];
  char comment[FLEN_COMMENT];
  
  fitsfile *mfptr = NULL;


  if(*status != 0) return(*status);

  /* get the number of members contained by this grouping table */

  *status = fits_get_num_members(gfptr,&nmembers,status);

  /* loop over all group members and delete them */

  for(i = nmembers; i > 0 && *status == 0; --i)
    {
      /* open the member HDU */

      *status = fits_open_member(gfptr,i,&mfptr,status);

      /* if the member cannot be opened then just skip it and continue */

      if(*status == MEMBER_NOT_FOUND) 
	{
	  *status = 0;
	  continue;
	}

      /* Any other error is a reason to abort */
      
      if(*status != 0) continue;

      /* add the member HDU to the HDUtracker struct */

      *status = fftsad(mfptr,HDU,NULL,NULL);

      /* status == HDU_ALREADY_TRACKED ==> HDU has already been processed */

      if(*status == HDU_ALREADY_TRACKED) 
	{
	  *status = 0;
	  fits_close_file(mfptr,status);
	  continue;
	}
      else if(*status != 0) continue;

      /* determine if the member HDU is itself a grouping table */

      *status = fits_read_key_str(mfptr,"EXTNAME",keyvalue,comment,status);

      /* if no EXTNAME is found then the HDU cannot be a grouping table */ 

      if(*status == KEY_NO_EXIST) 
	{
	  *status     = 0;
	  keyvalue[0] = 0;
	}
      prepare_keyvalue(keyvalue);

      /* Any other error is a reason to abort */
      
      if(*status != 0) continue;

      /* 
	 if the EXTNAME == GROUPING then the member is a grouping table 
	 and we must call ffgtrmr() to process its members
      */

      if(fits_strcasecmp(keyvalue,"GROUPING") == 0)
	  *status = ffgtrmr(mfptr,HDU,status);  

      /* 
	 unlink all the grouping tables that contain this HDU as a member 
	 and then delete the HDU (if not a PHDU)
      */

      if(fits_get_hdu_num(mfptr,&hdutype) == 1)
	      *status = ffgmul(mfptr,1,status);
      else
	  {
	      *status = ffgmul(mfptr,0,status);
	      *status = fits_delete_hdu(mfptr,&hdutype,status);
	  }

      /* close the fitsfile pointer */

      fits_close_file(mfptr,status);
    }

  return(*status);
}